

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

ItaniumPartialDemangler * __thiscall
llvm::ItaniumPartialDemangler::operator=
          (ItaniumPartialDemangler *this,ItaniumPartialDemangler *Other)

{
  ItaniumPartialDemangler *Other_local;
  ItaniumPartialDemangler *this_local;
  
  std::swap<void*>(&this->RootNode,&Other->RootNode);
  std::swap<void*>(&this->Context,&Other->Context);
  return this;
}

Assistant:

ItaniumPartialDemangler &ItaniumPartialDemangler::
operator=(ItaniumPartialDemangler &&Other) {
  std::swap(RootNode, Other.RootNode);
  std::swap(Context, Other.Context);
  return *this;
}